

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O2

void fmt::v11::detail::format_error_code(buffer<char> *out,int error_code,string_view message)

{
  uint uVar1;
  uint uVar2;
  make_unsigned_t<int> mVar3;
  char (*in_R9) [3];
  format_string<fmt::v11::basic_string_view<char>_&,_const_char_(&)[3]> fmt;
  format_string<const_char_(&)[7],_int_&> fmt_00;
  int error_code_local;
  appender it;
  string_view message_local;
  
  message_local.data_ = message.data_;
  error_code_local = error_code;
  message_local.size_ = message.size_;
  buffer<char>::try_resize(out,0);
  uVar2 = -error_code;
  if (0 < error_code) {
    uVar2 = error_code;
  }
  uVar1 = 0x1f;
  if ((uVar2 | 1) != 0) {
    for (; (uVar2 | 1) >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  mVar3 = to_unsigned<int>((int)((ulong)uVar2 +
                                 *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar1 * 8)
                                >> 0x20));
  it.container = out;
  if (message.size_ <= 0x1ec - ((ulong)((uint)error_code >> 0x1f) + (ulong)mVar3)) {
    fmt.str.size_ = (size_t)&message_local;
    fmt.str.data_ = (char *)0x4;
    format_to<fmt::v11::basic_appender<char>_&,_fmt::v11::basic_string_view<char>_&,_const_char_(&)[3],_0>
              ((v11 *)&it,(basic_appender<char> *)"{}{}",fmt,(basic_string_view<char> *)": ",in_R9);
  }
  fmt_00.str.size_ = (size_t)"error ";
  fmt_00.str.data_ = (char *)0x4;
  format_to<fmt::v11::basic_appender<char>_&,_const_char_(&)[7],_int_&,_0>
            ((v11 *)&it,(basic_appender<char> *)"{}{}",fmt_00,(char (*) [7])&error_code_local,
             (int *)in_R9);
  if (out->size_ < 0x1f5) {
    return;
  }
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/DiscordPP[P]echo-bot/build_O2/_deps/fmt-src/include/fmt/format-inl.h"
              ,0x3f,"");
}

Assistant:

FMT_FUNC void format_error_code(detail::buffer<char>& out, int error_code,
                                string_view message) noexcept {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.try_resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (detail::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += detail::to_unsigned(detail::count_digits(abs_value));
  auto it = appender(out);
  if (message.size() <= inline_buffer_size - error_code_size)
    fmt::format_to(it, FMT_STRING("{}{}"), message, SEP);
  fmt::format_to(it, FMT_STRING("{}{}"), ERROR_STR, error_code);
  FMT_ASSERT(out.size() <= inline_buffer_size, "");
}